

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessage.hpp
# Opt level: O0

ssize_t __thiscall
cppassert::internal::PointerHelper<void>::write
          (PointerHelper<void> *this,int __fd,void *__buf,size_t __n)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *this_00;
  undefined4 in_register_00000034;
  uintptr_t value;
  void *pointer_local;
  PointerHelper<void> *this_local;
  
  poVar3 = std::operator<<(this->stream_,"0x");
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  _Var2 = std::setw(0x10);
  poVar3 = std::operator<<(poVar3,_Var2);
  this_00 = (void *)std::ostream::operator<<(poVar3,std::hex);
  std::ostream::operator<<(this_00,CONCAT44(in_register_00000034,__fd));
  return (ssize_t)this->stream_;
}

Assistant:

std::ostream& write(void const *pointer) 
        {
            std::uintptr_t value = reinterpret_cast<std::uintptr_t>(pointer);
            (*stream_)<<"0x"
                <<std::setfill ('0') << std::setw(sizeof(void const *)*2)
                <<std::hex
                <<value;
                         
            return (*stream_);
        }